

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O2

void __thiscall wasm::MultiMemoryLowering::makeOffsetGlobals(MultiMemoryLowering *this)

{
  pointer puVar1;
  Module *module;
  mapped_type *pmVar2;
  mapped_type mVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string_view local_80;
  anon_class_8_1_8991fb9c local_70;
  anon_class_8_1_8991fb9c addGlobal;
  undefined1 local_58 [8];
  Name name;
  long local_38;
  
  addGlobal.this = (MultiMemoryLowering *)&this->memoryIdxMap;
  local_38 = 0;
  pcVar4 = (char *)0x0;
  local_70.this = this;
  while (puVar1 = (this->wasm->memories).
                  super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pcVar4 < (char *)((long)(this->wasm->memories).
                                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    name.super_IString.str._M_str = pcVar4;
    pmVar2 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)addGlobal.this,
                          (key_type *)
                          puVar1[(long)pcVar4]._M_t.
                          super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                          _M_t);
    mVar3 = (mapped_type)name.super_IString.str._M_str;
    *pmVar2 = mVar3;
    if (mVar3 != 0) {
      module = this->wasm;
      IString::toString_abi_cxx11_
                (&local_a0,
                 (IString *)
                 puVar1[(long)pcVar4]._M_t.
                 super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t);
      std::operator+(&local_c0,&local_a0,"_byte_offset");
      IString::IString((IString *)&local_80,&local_c0);
      _local_58 = (string_view)Names::getValidGlobalName(module,(Name)local_80);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::vector<wasm::Name,_std::allocator<wasm::Name>_>::emplace_back<wasm::Name>
                (&this->offsetGlobalNames,(Name *)local_58);
      makeOffsetGlobals::anon_class_8_1_8991fb9c::operator()
                (&local_70,(Name)_local_58,local_38 << 0x10);
      mVar3 = (mapped_type)name.super_IString.str._M_str;
    }
    local_38 = local_38 +
               *(long *)((long)puVar1[(long)pcVar4]._M_t.
                               super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                               ._M_t + 0x38);
    pcVar4 = (char *)(ulong)(mVar3 + 1);
  }
  return;
}

Assistant:

void makeOffsetGlobals() {
    auto addGlobal = [&](Name name, size_t offset) {
      auto global = Builder::makeGlobal(
        name,
        pointerType,
        Builder(*wasm).makeConst(Literal::makeFromInt64(offset, pointerType)),
        Builder::Mutable);
      wasm->addGlobal(std::move(global));
    };

    size_t offsetRunningTotal = 0;
    for (Index i = 0; i < wasm->memories.size(); i++) {
      auto& memory = wasm->memories[i];
      memoryIdxMap[memory->name] = i;
      // We don't need a page offset global for the first memory as it's always
      // 0
      if (i != 0) {
        Name name = Names::getValidGlobalName(
          *wasm, memory->name.toString() + "_byte_offset");
        offsetGlobalNames.push_back(std::move(name));
        addGlobal(name, offsetRunningTotal * Memory::kPageSize);
      }
      offsetRunningTotal += memory->initial;
    }
  }